

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O0

void __thiscall QTabBar::changeEvent(QTabBar *this,QEvent *event)

{
  Type TVar1;
  TextElideMode TVar2;
  int iVar3;
  QTabBarPrivate *event_00;
  QStyle *pQVar4;
  QWidget *in_RSI;
  QWidget *in_RDI;
  QTabBarPrivate *d;
  undefined4 in_stack_ffffffffffffffe0;
  
  event_00 = d_func((QTabBar *)0x6b3660);
  TVar1 = QEvent::type((QEvent *)in_RSI);
  if (TVar1 != FontChange) {
    if (TVar1 != StyleChange) goto LAB_006b376d;
    if ((*(ushort *)&event_00->field_0x2d0 >> 2 & 1) == 0) {
      pQVar4 = QWidget::style(in_RDI);
      TVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x43,0,in_RDI);
      event_00->elideMode = TVar2;
    }
    if ((*(ushort *)&event_00->field_0x2d0 >> 4 & 1) == 0) {
      pQVar4 = QWidget::style(in_RDI);
      iVar3 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x26,0,in_RDI);
      *(ushort *)&event_00->field_0x2d0 =
           *(ushort *)&event_00->field_0x2d0 & 0xfff7 | (ushort)((iVar3 != 0 ^ 0xffU) & 1) << 3;
    }
  }
  QHash<QString,_QSize>::clear((QHash<QString,_QSize> *)CONCAT44(TVar1,in_stack_ffffffffffffffe0));
  QTabBarPrivate::refresh((QTabBarPrivate *)CONCAT44(TVar1,in_stack_ffffffffffffffe0));
LAB_006b376d:
  QWidget::changeEvent(in_RSI,(QEvent *)event_00);
  return;
}

Assistant:

void QTabBar::changeEvent(QEvent *event)
{
    Q_D(QTabBar);
    switch (event->type()) {
    case QEvent::StyleChange:
        if (!d->elideModeSetByUser)
            d->elideMode = Qt::TextElideMode(style()->styleHint(QStyle::SH_TabBar_ElideMode, nullptr, this));
        if (!d->useScrollButtonsSetByUser)
            d->useScrollButtons = !style()->styleHint(QStyle::SH_TabBar_PreferNoArrows, nullptr, this);
        Q_FALLTHROUGH();
    case QEvent::FontChange:
        d->textSizes.clear();
        d->refresh();
        break;
    default:
        break;
    }

    QWidget::changeEvent(event);
}